

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::SolverState::SolverState(SolverState *this,SolverState *from)

{
  void *pvVar1;
  int32 iVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverState_0075f940;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField
            (&this->history_,&from->history_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->learned_net_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->learned_net_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->learned_net_).ptr_);
  }
  iVar2 = from->current_step_;
  this->iter_ = from->iter_;
  this->current_step_ = iVar2;
  return;
}

Assistant:

SolverState::SolverState(const SolverState& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      history_(from.history_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  learned_net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_learned_net()) {
    learned_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.learned_net_);
  }
  ::memcpy(&iter_, &from.iter_,
    reinterpret_cast<char*>(&current_step_) -
    reinterpret_cast<char*>(&iter_) + sizeof(current_step_));
  // @@protoc_insertion_point(copy_constructor:caffe.SolverState)
}